

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O1

void __thiscall
absl::lts_20250127::Cord::InlineRep::CommitTree
          (InlineRep *this,Nullable<const_CordRep_*> old_rep,Nonnull<CordRep_*> rep,
          CordzUpdateScope *scope,MethodIdentifier method)

{
  CordzInfo *pCVar1;
  long sampling_stride;
  long *in_FS_OFFSET;
  
  if (old_rep == (Nullable<const_CordRep_*>)0x0) {
    if (rep == (Nonnull<CordRep_*>)0x0) {
      __assert_fail("rep",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x4e8,
                    "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                   );
    }
    (this->data_).rep_.field_0.as_tree.rep = rep;
    (this->data_).rep_.field_0.as_tree.cordz_info = 1;
    if (in_FS_OFFSET[-0xb] < 2) {
      sampling_stride =
           cord_internal::cordz_should_profile_slow((SamplingState *)(*in_FS_OFFSET + -0x58));
    }
    else {
      in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
      sampling_stride = 0;
    }
    if (0 < sampling_stride) {
      cord_internal::CordzInfo::TrackCord(&this->data_,method,sampling_stride);
      return;
    }
  }
  else {
    if (rep == (Nonnull<CordRep_*>)0x0) {
      __assert_fail("rep",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x4f6,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    if (((this->data_).rep_.field_0.data[0] & 1U) == 0) {
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x4f7,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    (this->data_).rep_.field_0.as_tree.rep = rep;
    pCVar1 = scope->info_;
    if (pCVar1 != (CordzInfo *)0x0) {
      Mutex::AssertHeld(&pCVar1->mutex_);
      pCVar1->rep_ = rep;
    }
  }
  return;
}

Assistant:

inline void Cord::InlineRep::CommitTree(absl::Nullable<const CordRep*> old_rep,
                                        absl::Nonnull<CordRep*> rep,
                                        const CordzUpdateScope& scope,
                                        MethodIdentifier method) {
  if (old_rep) {
    SetTree(rep, scope);
  } else {
    EmplaceTree(rep, method);
  }
}